

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

bool __thiscall mjs::native_object::delete_property(native_object *this,wstring_view *name)

{
  bool bVar1;
  native_object_property *elem;
  gc_heap *h;
  gc_vector<mjs::native_object::native_object_property> *this_00;
  native_object_property *it;
  wstring_view *name_local;
  native_object *this_local;
  
  elem = find(this,name);
  if (elem == (native_object_property *)0x0) {
    this_local._7_1_ = object::delete_property(&this->super_object,name);
  }
  else {
    bVar1 = has_attributes(elem->attributes,dont_delete);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      h = object::heap(&this->super_object);
      this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>
                ::dereference(&this->native_properties_,h);
      gc_vector<mjs::native_object::native_object_property>::erase(this_00,elem);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool native_object::delete_property(const std::wstring_view& name) {
    if (auto it = find(name)) {
        if (has_attributes(it->attributes, property_attribute::dont_delete)) {
            return false;
        }
        native_properties_.dereference(heap()).erase(it);
        return true;
    }
    return object::delete_property(name);
}